

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<CheckedSharedTimedMutexTest,_testing::internal::TemplateSel<CheckedSharedTimedMutexTest_TryLockUntilWriterDeadlock_Test>,_testing::internal::Types<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  long *plVar4;
  _Alloc_hider type_param;
  int iVar5;
  long *plVar6;
  char *pcVar7;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  long *plVar8;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *type;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  allocator local_161;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  char *local_158;
  long local_150;
  char local_148 [8];
  undefined8 uStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  char *local_118;
  long local_110;
  char local_108 [8];
  undefined8 uStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  CodeLocation local_78;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_160 = type_names;
  std::__cxx11::string::string((string *)local_50,prefix,&local_161);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  local_f8 = &local_e8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_e8 = *plVar8;
    lStack_e0 = plVar6[3];
  }
  else {
    local_e8 = *plVar8;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_d8 = &local_c8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_c8 = *plVar8;
    lStack_c0 = plVar6[3];
  }
  else {
    local_c8 = *plVar8;
    local_d8 = (long *)*plVar6;
  }
  local_d0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_b8 = &local_a8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_a8 = *plVar8;
    lStack_a0 = plVar6[3];
  }
  else {
    local_a8 = *plVar8;
    local_b8 = (long *)*plVar6;
  }
  local_b0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b8,
                              (ulong)(local_160->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[index]._M_dataplus.
                                     _M_p);
  local_138 = &local_128;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_128 = *plVar8;
    lStack_120 = plVar6[3];
  }
  else {
    local_128 = *plVar8;
    local_138 = (long *)*plVar6;
  }
  plVar4 = local_138;
  local_130 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar7 = strchr(test_names,0x2c);
  if (pcVar7 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_158,test_names,(allocator *)&local_98);
    type = extraout_RDX_00;
  }
  else {
    local_158 = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,test_names,pcVar7);
    type = extraout_RDX;
  }
  local_160 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)plVar4;
  pcVar7 = local_158;
  if (local_150 != 0) {
    pcVar9 = local_158 + local_150;
    do {
      pcVar3 = local_158;
      iVar5 = isspace((uint)(byte)pcVar9[-1]);
      type = extraout_RDX_01;
      pcVar7 = pcVar3;
      if (iVar5 == 0) break;
      pcVar10 = pcVar9 + -1;
      uVar11 = (long)pcVar10 - (long)pcVar3;
      std::__cxx11::string::_M_erase((ulong)&local_158,uVar11);
      pcVar9 = local_158 + uVar11;
      type = extraout_RDX_02;
      pcVar7 = local_158;
    } while (pcVar10 != pcVar3);
  }
  if (pcVar7 == local_148) {
    uStack_100 = uStack_140;
    pcVar7 = local_108;
  }
  local_110 = local_150;
  local_150 = 0;
  local_148[0] = '\0';
  local_158 = local_148;
  local_118 = pcVar7;
  GetTypeName_abi_cxx11_
            (&local_98,
             (internal *)
             &yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::typeinfo,type);
  type_param._M_p = local_98._M_dataplus._M_p;
  paVar1 = &local_78.file.field_2;
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_78.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  local_78.line = code_location->line;
  set_up_tc = SuiteApiResolver<CheckedSharedTimedMutexTest_TryLockUntilWriterDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,local_78.line);
  tear_down_tc = SuiteApiResolver<CheckedSharedTimedMutexTest_TryLockUntilWriterDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00200e48;
  MakeAndRegisterTestInfo
            ((char *)local_160,pcVar7,type_param._M_p,(char *)0x0,&local_78,
             &TypeIdHelper<CheckedSharedTimedMutexTest<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return true;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }